

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

string * __thiscall
viennamath::rt_variable<viennamath::rt_expression_interface<double>>::deep_str_abi_cxx11_
          (string *__return_storage_ptr__,
          rt_variable<viennamath::rt_expression_interface<double>> *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"variable(",9);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string deep_str() const
      {
        std::stringstream ss;
        ss << "variable(" << id_ << ")";
        return ss.str();
      }